

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O1

void __thiscall
Saturation::SaturationAlgorithm::addUnprocessedClause(SaturationAlgorithm *this,Clause *cl)

{
  Clause *cl_00;
  
  this->_generatedClauseCount = this->_generatedClauseCount + 1;
  *(int *)(DAT_00b7e1c0 + 0x1d4) = *(int *)(DAT_00b7e1c0 + 0x1d4) + 1;
  cl_00 = doImmediateSimplification(this,cl);
  if (cl_00 == (Clause *)0x0) {
    return;
  }
  if ((*(uint *)&cl_00->field_0x38 & 0xfffff) != 0) {
    Kernel::Clause::setStore(cl_00,UNPROCESSED);
    (*(this->_unprocessed->super_ClauseContainer)._vptr_ClauseContainer[2])
              (this->_unprocessed,cl_00);
    return;
  }
  handleEmptyClause(this,cl_00);
  return;
}

Assistant:

void SaturationAlgorithm::addUnprocessedClause(Clause* cl)
{
  _generatedClauseCount++;
  env.statistics->generatedClauses++;

  cl=doImmediateSimplification(cl);
  if (!cl) {
    return;
  }
  if (cl->isEmpty()) {
    handleEmptyClause(cl);
    return;
  }

  cl->setStore(Clause::UNPROCESSED);
  _unprocessed->add(cl);
}